

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicStruct::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,Field field)

{
  int *__return_storage_ptr___00;
  Field FVar1;
  Field field_00;
  Field field_01;
  Field field_02;
  Builder builder;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  uint32_t offset;
  StructPointerOffset ptrIndex;
  Orphan<capnp::DynamicValue> *pOVar5;
  StructSchema schema;
  NullableValue<capnp::StructSchema::Field> *pNVar6;
  Field *pFVar7;
  Orphan<capnp::DynamicStruct> *other;
  uint uVar8;
  Iterator IVar9;
  undefined8 uVar10;
  Orphan<capnp::DynamicValue> local_7c0;
  Schema local_788;
  Schema SStack_780;
  uint local_778;
  undefined4 uStack_774;
  SegmentReader *pSStack_770;
  CapTableReader *local_768;
  void *pvStack_760;
  WirePointer *local_758;
  StructDataBitCount SStack_750;
  StructPointerCount SStack_74c;
  undefined2 uStack_74a;
  RawBrandedSchema *local_748;
  Schema SStack_740;
  uint local_738;
  undefined4 uStack_734;
  SegmentReader *pSStack_730;
  CapTableReader *local_728;
  void *pvStack_720;
  WirePointer *local_718;
  StructDataBitCount SStack_710;
  StructPointerCount SStack_70c;
  undefined2 uStack_70a;
  undefined1 auStack_708 [8];
  Field field_1;
  undefined1 local_6b8 [8];
  Iterator __end3;
  undefined1 local_698 [8];
  Iterator __begin3;
  FieldSubset *__range3;
  Maybe<capnp::StructSchema::Field> local_5f8;
  undefined1 local_5b0 [8];
  NullableValue<capnp::StructSchema::Field> unionField_1;
  Orphan<capnp::DynamicValue> local_520;
  RawBrandedSchema *local_4e8;
  undefined8 uStack_4e0;
  SegmentReader *local_4d8;
  CapTableReader *pCStack_4d0;
  void *local_4c8;
  WirePointer *pWStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  Maybe<capnp::StructSchema::Field> local_4a0;
  undefined1 local_458 [8];
  NullableValue<capnp::StructSchema::Field> unionField;
  Builder dst;
  Orphanage local_3a0;
  undefined1 local_390 [8];
  Orphan<capnp::DynamicStruct> result_1;
  Builder local_320;
  undefined1 local_2e0 [8];
  BuilderFor<capnp::DynamicStruct> src;
  OrphanBuilder local_298;
  Builder local_278;
  RawBrandedSchema *local_238;
  undefined8 uStack_230;
  SegmentReader *local_228;
  CapTableReader *pCStack_220;
  void *local_218;
  WirePointer *pWStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  Builder value;
  OrphanBuilder local_168;
  RawBrandedSchema *local_148;
  undefined8 uStack_140;
  SegmentReader *local_138;
  CapTableReader *pCStack_130;
  void *local_128;
  WirePointer *pWStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  Builder local_100;
  undefined1 local_c0 [8];
  Orphan<capnp::DynamicValue> result;
  undefined1 local_78 [8];
  Reader slot;
  Reader proto;
  Builder *this_local;
  
  __return_storage_ptr___00 = &slot._reader.nestingLimit;
  StructSchema::Field::getProto((Reader *)__return_storage_ptr___00,&field);
  WVar3 = capnp::schema::Field::Reader::which((Reader *)__return_storage_ptr___00);
  if (WVar3 != SLOT) {
    if (WVar3 == GROUP) {
      result_1.builder.location = (word *)field.parent.super_Schema.raw;
      uVar10 = field.proto._reader._32_8_;
      get(&local_320,this,field);
      DynamicValue::Builder::as<capnp::DynamicStruct>
                ((BuilderFor<capnp::DynamicStruct> *)local_2e0,&local_320);
      DynamicValue::Builder::~Builder(&local_320);
      builder.builder.dataSize = (StructDataBitCount)uVar10;
      builder.builder.pointerCount = SUB82(uVar10,4);
      builder.builder._38_2_ = SUB82(uVar10,6);
      builder._0_40_ = this->builder;
      local_3a0 = Orphanage::getForMessageContaining<capnp::DynamicStruct::Builder>(builder);
      schema = getSchema((Builder *)local_2e0);
      Orphanage::newOrphan((Orphan<capnp::DynamicStruct> *)local_390,&local_3a0,schema);
      Orphan<capnp::DynamicStruct>::get
                ((Builder *)&unionField.field_1.value.proto._reader.nestingLimit,
                 (Orphan<capnp::DynamicStruct> *)local_390);
      which(&local_4a0,(Builder *)local_2e0);
      pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_4a0);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_458,pNVar6);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_4a0);
      pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_458);
      if (pFVar7 != (Field *)0x0) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                           ((NullableValue<capnp::StructSchema::Field> *)local_458);
        local_4e8 = (pFVar7->parent).super_Schema.raw;
        uStack_4e0 = *(undefined8 *)&pFVar7->index;
        local_4d8 = (pFVar7->proto)._reader.segment;
        pCStack_4d0 = (pFVar7->proto)._reader.capTable;
        local_4c8 = (pFVar7->proto)._reader.data;
        pWStack_4c0 = (pFVar7->proto)._reader.pointers;
        local_4b8._0_4_ = (pFVar7->proto)._reader.dataSize;
        local_4b8._4_2_ = (pFVar7->proto)._reader.pointerCount;
        local_4b8._6_2_ = *(undefined2 *)&(pFVar7->proto)._reader.field_0x26;
        uStack_4b0 = *(undefined8 *)&(pFVar7->proto)._reader.nestingLimit;
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                           ((NullableValue<capnp::StructSchema::Field> *)local_458);
        unionField_1.field_1._56_8_ = (pFVar7->parent).super_Schema.raw;
        disown(&local_520,(Builder *)local_2e0,*pFVar7);
        FVar1._8_8_ = uStack_4e0;
        FVar1.parent.super_Schema.raw = (Schema)(Schema)local_4e8;
        FVar1.proto._reader.segment = local_4d8;
        FVar1.proto._reader.capTable = pCStack_4d0;
        FVar1.proto._reader.data = local_4c8;
        FVar1.proto._reader.pointers = pWStack_4c0;
        FVar1.proto._reader.dataSize = (undefined4)local_4b8;
        FVar1.proto._reader.pointerCount = local_4b8._4_2_;
        FVar1.proto._reader._38_2_ = local_4b8._6_2_;
        FVar1.proto._reader._40_8_ = uStack_4b0;
        adopt((Builder *)&unionField.field_1.value.proto._reader.nestingLimit,FVar1,&local_520);
        Orphan<capnp::DynamicValue>::~Orphan(&local_520);
      }
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_458);
      StructSchema::getFieldByDiscriminant(&local_5f8,(StructSchema *)local_2e0,0);
      pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_5f8);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_5b0,pNVar6);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_5f8);
      pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_5b0);
      if (pFVar7 != (Field *)0x0) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                           ((NullableValue<capnp::StructSchema::Field> *)local_5b0);
        clear((Builder *)local_2e0,*pFVar7);
      }
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_5b0);
      StructSchema::getNonUnionFields((FieldSubset *)&__begin3.index,(StructSchema *)local_2e0);
      IVar9 = StructSchema::FieldSubset::begin((FieldSubset *)&__begin3.index);
      __end3._8_8_ = IVar9.container;
      __begin3.container._0_4_ = IVar9.index;
      local_698 = (undefined1  [8])__end3._8_8_;
      IVar9 = StructSchema::FieldSubset::end((FieldSubset *)&__begin3.index);
      field_1.proto._reader._40_8_ = IVar9.container;
      __end3.container._0_4_ = IVar9.index;
      local_6b8 = (undefined1  [8])field_1.proto._reader._40_8_;
      while (bVar2 = _::
                     IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                     ::operator!=((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                                   *)local_698,
                                  (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                                   *)local_6b8), bVar2) {
        _::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
        operator*((Field *)auStack_708,
                  (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                   *)local_698);
        local_718 = field_1.proto._reader.pointers;
        SStack_710 = field_1.proto._reader.dataSize;
        SStack_70c = field_1.proto._reader.pointerCount;
        uStack_70a = field_1.proto._reader._38_2_;
        local_728 = field_1.proto._reader.capTable;
        pvStack_720 = field_1.proto._reader.data;
        local_738 = field_1.index;
        uStack_734 = field_1._12_4_;
        pSStack_730 = field_1.proto._reader.segment;
        local_748 = (RawBrandedSchema *)auStack_708;
        SStack_740 = field_1.parent.super_Schema.raw;
        field_00._8_8_ = field_1.parent.super_Schema.raw;
        field_00.parent.super_Schema.raw = (Schema)(Schema)auStack_708;
        field_00.proto._reader.segment = (SegmentReader *)field_1._8_8_;
        field_00.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
        field_00.proto._reader.data = field_1.proto._reader.capTable;
        field_00.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
        field_00.proto._reader._32_8_ = field_1.proto._reader.pointers;
        field_00.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
        field_00.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
        field_00.proto._reader._46_2_ = field_1.proto._reader._38_2_;
        bVar2 = has((Builder *)local_2e0,field_00,NON_NULL);
        if (bVar2) {
          local_758 = field_1.proto._reader.pointers;
          SStack_750 = field_1.proto._reader.dataSize;
          SStack_74c = field_1.proto._reader.pointerCount;
          uStack_74a = field_1.proto._reader._38_2_;
          local_768 = field_1.proto._reader.capTable;
          pvStack_760 = field_1.proto._reader.data;
          local_778 = field_1.index;
          uStack_774 = field_1._12_4_;
          pSStack_770 = field_1.proto._reader.segment;
          local_788.raw = (RawBrandedSchema *)auStack_708;
          SStack_780 = field_1.parent.super_Schema.raw;
          field_01._8_8_ = field_1.parent.super_Schema.raw;
          field_01.parent.super_Schema.raw = (Schema)(Schema)auStack_708;
          field_01.proto._reader.segment = (SegmentReader *)field_1._8_8_;
          field_01.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
          field_01.proto._reader.data = field_1.proto._reader.capTable;
          field_01.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
          field_01.proto._reader._32_8_ = field_1.proto._reader.pointers;
          field_01.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
          field_01.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
          field_01.proto._reader._46_2_ = field_1.proto._reader._38_2_;
          disown(&local_7c0,(Builder *)local_2e0,field_01);
          field_02._8_8_ = SStack_780.raw;
          field_02.parent.super_Schema.raw = (Schema)(Schema)local_788.raw;
          field_02.proto._reader.segment = (SegmentReader *)_local_778;
          field_02.proto._reader.capTable = (CapTableReader *)pSStack_770;
          field_02.proto._reader.data = local_768;
          field_02.proto._reader.pointers = (WirePointer *)pvStack_760;
          field_02.proto._reader._32_8_ = local_758;
          field_02.proto._reader.nestingLimit = SStack_750;
          field_02.proto._reader._44_2_ = SStack_74c;
          field_02.proto._reader._46_2_ = uStack_74a;
          adopt((Builder *)&unionField.field_1.value.proto._reader.nestingLimit,field_02,&local_7c0)
          ;
          Orphan<capnp::DynamicValue>::~Orphan(&local_7c0);
        }
        _::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
        operator++((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                    *)local_698);
      }
      other = kj::mv<capnp::Orphan<capnp::DynamicStruct>>((Orphan<capnp::DynamicStruct> *)local_390)
      ;
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,other);
      Orphan<capnp::DynamicStruct>::~Orphan((Orphan<capnp::DynamicStruct> *)local_390);
      return __return_storage_ptr__;
    }
    kj::_::unreachable();
  }
  capnp::schema::Field::Reader::getSlot((Reader *)local_78,(Reader *)&slot._reader.nestingLimit);
  join_0x00000010_0x00000000_ = StructSchema::Field::getType(&field);
  WVar4 = capnp::Type::which((Type *)&result.builder.location);
  FVar1 = field;
  uVar8 = (uint)WVar4;
  if (WVar4 < TEXT) {
LAB_0022a9e0:
    local_148 = (RawBrandedSchema *)field.parent.super_Schema.raw;
    uStack_140._0_4_ = field.index;
    uStack_140._4_4_ = field._12_4_;
    local_138 = field.proto._reader.segment;
    pCStack_130 = field.proto._reader.capTable;
    local_128 = field.proto._reader.data;
    pWStack_120 = field.proto._reader.pointers;
    local_118._0_4_ = field.proto._reader.dataSize;
    local_118._4_2_ = field.proto._reader.pointerCount;
    local_118._6_2_ = field.proto._reader._38_2_;
    uStack_110._0_4_ = field.proto._reader.nestingLimit;
    uStack_110._4_4_ = field.proto._reader._44_4_;
    field = FVar1;
    get(&local_100,this,FVar1);
    _::OrphanBuilder::OrphanBuilder(&local_168);
    Orphan<capnp::DynamicValue>::Orphan
              ((Orphan<capnp::DynamicValue> *)local_c0,&local_100,&local_168);
    _::OrphanBuilder::~OrphanBuilder(&local_168);
    DynamicValue::Builder::~Builder(&local_100);
    value.field_1._48_8_ = field.parent.super_Schema.raw;
    clear(this,field);
    pOVar5 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_c0);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,pOVar5);
    Orphan<capnp::DynamicValue>::~Orphan((Orphan<capnp::DynamicValue> *)local_c0);
  }
  else {
    if (2 < uVar8 - 0xc) {
      if (uVar8 == 0xf) goto LAB_0022a9e0;
      if (2 < uVar8 - 0x10) {
        kj::_::unreachable();
      }
    }
    local_238 = (RawBrandedSchema *)field.parent.super_Schema.raw;
    uStack_230._0_4_ = field.index;
    uStack_230._4_4_ = field._12_4_;
    local_228 = field.proto._reader.segment;
    pCStack_220 = field.proto._reader.capTable;
    local_218 = field.proto._reader.data;
    pWStack_210 = field.proto._reader.pointers;
    local_208._0_4_ = field.proto._reader.dataSize;
    local_208._4_2_ = field.proto._reader.pointerCount;
    local_208._6_2_ = field.proto._reader._38_2_;
    uStack_200._0_4_ = field.proto._reader.nestingLimit;
    uStack_200._4_4_ = field.proto._reader._44_4_;
    field = FVar1;
    get((Builder *)local_1f8,this,FVar1);
    DynamicValue::Builder::Builder(&local_278,(Builder *)local_1f8);
    offset = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_78);
    ptrIndex = assumePointerOffset(offset);
    _::StructBuilder::getPointerField
              ((PointerBuilder *)&src.builder.dataSize,&this->builder,ptrIndex);
    _::PointerBuilder::disown(&local_298,(PointerBuilder *)&src.builder.dataSize);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&local_278,&local_298);
    _::OrphanBuilder::~OrphanBuilder(&local_298);
    DynamicValue::Builder::~Builder(&local_278);
    DynamicValue::Builder::~Builder((Builder *)local_1f8);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> DynamicStruct::Builder::disown(StructSchema::Field field) {
  // We end up calling get(field) below, so we don't need to validate `field` here.

  auto proto = field.getProto();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      switch (field.getType().which()) {
        case schema::Type::VOID:
        case schema::Type::BOOL:
        case schema::Type::INT8:
        case schema::Type::INT16:
        case schema::Type::INT32:
        case schema::Type::INT64:
        case schema::Type::UINT8:
        case schema::Type::UINT16:
        case schema::Type::UINT32:
        case schema::Type::UINT64:
        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
        case schema::Type::ENUM: {
          auto result = Orphan<DynamicValue>(get(field), _::OrphanBuilder());
          clear(field);
          return kj::mv(result);
        }

        case schema::Type::TEXT:
        case schema::Type::DATA:
        case schema::Type::LIST:
        case schema::Type::STRUCT:
        case schema::Type::ANY_POINTER:
        case schema::Type::INTERFACE: {
          auto value = get(field);
          return Orphan<DynamicValue>(
              value, builder.getPointerField(assumePointerOffset(slot.getOffset())).disown());
        }
      }
      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP: {
      // We have to allocate new space for the group, unfortunately.
      auto src = get(field).as<DynamicStruct>();

      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(src.getSchema());
      auto dst = result.get();

      KJ_IF_MAYBE(unionField, src.which()) {
        dst.adopt(*unionField, src.disown(*unionField));
      }

      // We need to explicitly reset the union to its default field.
      KJ_IF_MAYBE(unionField, src.schema.getFieldByDiscriminant(0)) {
        src.clear(*unionField);
      }

      for (auto field: src.schema.getNonUnionFields()) {
        if (src.has(field)) {
          dst.adopt(field, src.disown(field));
        }
      }

      return kj::mv(result);
    }
  }

  KJ_UNREACHABLE;
}